

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool operator_string_sub(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  int iVar1;
  gravity_object_t *pgVar2;
  uint uVar3;
  char *__s;
  size_t sVar4;
  gravity_fiber_t *fiber;
  char *s;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar5;
  uint uVar6;
  size_t size;
  gravity_class_t *s_00;
  uint32_t len;
  uint uVar7;
  gravity_value_t value;
  gravity_value_t gVar8;
  char _buffer [4096];
  char local_1038 [16];
  undefined8 local_1028;
  undefined7 uStack_1020;
  undefined4 uStack_1019;
  
  pgVar2 = (args->field_1).p;
  gVar8 = convert_value2string(vm,args[1]);
  aVar5 = gVar8.field_1;
  if (gVar8.isa == (gravity_class_t *)0x0) {
    local_1028._0_1_ = 't';
    local_1028._1_1_ = ' ';
    local_1028._2_1_ = 'o';
    local_1028._3_1_ = 'b';
    local_1028._4_1_ = 'j';
    local_1028._5_1_ = 'e';
    local_1028._6_1_ = 'c';
    local_1028._7_1_ = 't';
    uStack_1020 = 0x727453206f7420;
    builtin_strncpy(local_1038,"Unable to conver",0x10);
    uStack_1019 = 0x676e69;
LAB_0011e8a1:
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1038);
LAB_0011e8b4:
    value.field_1.n = 0;
    value.isa = gravity_class_null;
    gravity_vm_setslot(vm,value,rindex);
    return false;
  }
  s_00 = pgVar2->objclass;
  if (*(int *)((long)&(aVar5.p)->identifier + 4) == 0) {
    len = 0xffffffff;
  }
  else {
    __s = string_strnstr((char *)s_00,(char *)(aVar5.p)->objclass,
                         (ulong)*(uint *)((long)&pgVar2->identifier + 4));
    if (__s == (char *)0x0) {
      s_00 = pgVar2->objclass;
      len = *(uint32_t *)((long)&pgVar2->identifier + 4);
    }
    else {
      sVar4 = strlen(__s);
      uVar3 = *(uint *)((long)&(aVar5.p)->identifier + 4);
      uVar7 = (uint)sVar4;
      if (uVar3 != uVar7) {
        if (uVar3 <= uVar7) {
          uVar3 = uVar3 + *(int *)((long)&pgVar2->identifier + 4) + 1;
          size = 0x20;
          if (0x20 < uVar3) {
            size = (size_t)uVar3;
          }
          s = (char *)gravity_calloc(vm,1,size);
          if (s == (char *)0x0) goto LAB_0011e8b4;
          uVar6 = (int)__s - (int)pgVar2->objclass;
          iVar1 = *(int *)((long)&(aVar5.p)->identifier + 4);
          memcpy(s,pgVar2->objclass,(ulong)uVar6);
          uVar3 = *(uint *)((long)&(aVar5.p)->identifier + 4);
          memcpy(s + uVar6,__s + uVar3,(ulong)(uVar7 - uVar3));
          aVar5.p = (gravity_object_t *)
                    gravity_string_new(vm,s,(uVar7 - iVar1) + uVar6,(uint32_t)size);
          gVar8.field_1.p = (gravity_object_t *)aVar5.n;
          gVar8.isa = (aVar5.p)->isa;
          goto LAB_0011e8ee;
        }
        local_1038[0] = 'M';
        local_1038[1] = 'a';
        local_1038[2] = 'l';
        local_1038[3] = 'f';
        local_1038[4] = 'o';
        local_1038[5] = 'r';
        local_1038[6] = 'm';
        local_1038[7] = 'e';
        local_1038[8] = 'd';
        local_1038[9] = ' ';
        local_1038[10] = 's';
        local_1038[0xb] = 't';
        local_1038[0xc] = 'r';
        local_1038[0xd] = 'i';
        local_1038[0xe] = 'n';
        local_1038[0xf] = 'g';
        local_1028._0_2_ = 0x2e;
        goto LAB_0011e8a1;
      }
      s_00 = pgVar2->objclass;
      len = (int)__s - (int)s_00;
    }
  }
  gVar8 = gravity_string_to_value(vm,(char *)s_00,len);
LAB_0011e8ee:
  gravity_vm_setslot(vm,gVar8,rindex);
  return true;
}

Assistant:

static bool operator_string_sub (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_STRING(v2, true);

    gravity_string_t *s1 = VALUE_AS_STRING(v1);
    gravity_string_t *s2 = VALUE_AS_STRING(v2);
    
    // special case
    if (s2->len == 0) {
        RETURN_VALUE(VALUE_FROM_CSTRING(vm, s1->s), rindex);
    }
    
    // subtract s2 from s1
    char *found = string_strnstr(s1->s, s2->s, (size_t)s1->len);
    if (!found) RETURN_VALUE(VALUE_FROM_STRING(vm, s1->s, s1->len), rindex);

    // substring found
    // now check if entire substring must be considered
    uint32_t flen = (uint32_t)strlen(found);
    if (flen == s2->len) RETURN_VALUE(VALUE_FROM_STRING(vm, s1->s, (uint32_t)(found - s1->s)), rindex);
    // sanity check for malformed strings
    if (flen < s2->len) RETURN_ERROR("Malformed string.");

    // substring found but cannot be entirely considered
    uint32_t alloc = MAXNUM(s1->len + s2->len +1, DEFAULT_MINSTRING_SIZE);
    char *s = mem_alloc(vm, alloc);
    CHECK_MEM_ALLOC(s);

    uint32_t seek = (uint32_t)(found - s1->s);
    uint32_t len = seek + (flen - s2->len);
    memcpy(s, s1->s, seek);
    memcpy(s+seek, found+s2->len, flen - s2->len);

    gravity_string_t *string = gravity_string_new(vm, s, len, alloc);
    RETURN_VALUE(VALUE_FROM_OBJECT(string), rindex);
}